

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)24>_> *
vkt::api::anon_unknown_1::CommandPool::create
          (Move<vk::Handle<(vk::HandleType)24>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  VkCommandPoolCreateInfo cmdPoolInfo;
  VkCommandPoolCreateInfo local_20;
  
  local_20.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_20.pNext = (void *)0x0;
  local_20.flags = *(VkCommandPoolCreateFlags *)param_2;
  local_20.queueFamilyIndex = env->queueFamilyIndex;
  ::vk::createCommandPool
            (__return_storage_ptr__,env->vkd,env->device,&local_20,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkCommandPool> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkCommandPoolCreateInfo	cmdPoolInfo	=
		{
			VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,
			DE_NULL,
			params.flags,
			env.queueFamilyIndex,
		};

		return createCommandPool(env.vkd, env.device, &cmdPoolInfo, env.allocationCallbacks);
	}